

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O2

void __thiscall
flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,HandlerCallInstr *handlerCallInstr)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = (int)((ulong)((long)(handlerCallInstr->super_Instr).operands_.
                              super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(handlerCallInstr->super_Instr).operands_.
                             super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  lVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar4) {
    uVar3 = (ulong)uVar4;
  }
  for (; uVar3 * 8 != lVar2; lVar2 = lVar2 + 8) {
    emitLoad(this,*(Value **)
                   ((long)(handlerCallInstr->super_Instr).operands_.
                          super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar2 + 8));
  }
  sVar1 = ConstantPool::makeNativeHandler
                    (&this->cp_,
                     (IRBuiltinHandler *)
                     *(handlerCallInstr->super_Instr).operands_.
                      super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
  emitInstr(this,HANDLER,(Operand)sVar1,
            (short)((uint)(*(int *)&(handlerCallInstr->super_Instr).operands_.
                                    super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(handlerCallInstr->super_Instr).operands_.
                                   super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
  if (uVar4 != 0) {
    pop(this,(long)(int)uVar4);
    return;
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(HandlerCallInstr& handlerCallInstr) {
  int argc = handlerCallInstr.operands().size() - 1;
  for (int i = 1; i <= argc; ++i)
    emitLoad(handlerCallInstr.operand(i));

  emitInstr(Opcode::HANDLER,
      cp_.makeNativeHandler(handlerCallInstr.callee()),
      handlerCallInstr.operands().size() - 1);

  if (argc)
    pop(argc);
}